

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateLevelIndex(ValidationContext *this)

{
  ulong uVar1;
  bool bVar2;
  __optional_eq_t<unsigned_char,_int> _Var3;
  byte bVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ktxLevelIndexEntry *pkVar8;
  ValidationContext *this_00;
  size_type sVar9;
  reference pvVar10;
  uint *puVar11;
  long *in_RDI;
  size_t expectedUncompressedLength;
  size_t expectedLength;
  bool disableByteLengthValidation;
  unsigned_long expectedOffset;
  bool knownLevelOffset;
  value_type *level;
  uint32_t index;
  uint32_t it;
  size_t lastByteLength;
  size_t lastByteOffset;
  size_t i;
  size_t expectedFirstLevelOffset;
  size_t requiredLevelAlignment;
  uchar blockByteLength;
  unsigned_long levelIndexSize;
  unsigned_long levelIndexOffset;
  int *in_stack_fffffffffffffee8;
  ktxSupercmpScheme in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint uVar12;
  optional<unsigned_char> *in_stack_fffffffffffffef8;
  uint32_t level_00;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  reference in_stack_ffffffffffffff08;
  ValidationContext *in_stack_ffffffffffffff10;
  uint local_b0;
  uint local_ac;
  size_t local_a8;
  size_t local_a0;
  undefined4 local_98;
  char local_91;
  optional<unsigned_char> *local_90;
  undefined1 local_81;
  unsigned_long *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  unsigned_long *in_stack_ffffffffffffff90;
  IssueError *issue;
  unsigned_long *in_stack_ffffffffffffff98;
  IssueError *in_stack_ffffffffffffffa0;
  ValidationContext *in_stack_ffffffffffffffa8;
  ulong local_50;
  undefined8 local_28;
  undefined8 local_20;
  
  std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::resize
            ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
             in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  uVar6 = *(uint *)((long)in_RDI + 0x8c);
  pkVar8 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::data
                     ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)0x2b2db2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (char *)in_stack_fffffffffffffef8);
  (**(code **)(*in_RDI + 0x10))(in_RDI,0x50,pkVar8,(ulong)uVar6 * 0x18,local_28,local_20);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::array<unsigned_char,_8UL>_> *)0x2b2e13);
  if (bVar2) {
    std::optional<std::array<unsigned_char,_8UL>_>::operator->
              ((optional<std::array<unsigned_char,_8UL>_> *)0x2b2e2a);
    std::array<unsigned_char,_8UL>::at
              ((array<unsigned_char,_8UL> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (size_type)in_stack_fffffffffffffee8);
  }
  else {
    _Var3 = std::operator==((optional<unsigned_char> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffee8);
    if (!_Var3) {
      std::optional<unsigned_char>::value_or<int>
                (in_stack_fffffffffffffef8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  }
  uVar5 = calcLevelAlignment(in_stack_fffffffffffffef0,
                             (uint8_t)((ulong)in_stack_fffffffffffffee8 >> 0x38));
  this_00 = (ValidationContext *)
            align<unsigned_long>
                      (CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (unsigned_long)in_stack_fffffffffffffee8);
  for (local_50 = 1;
      sVar9 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::size
                        ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                         (in_RDI + 0x13)), local_50 < sVar9; local_50 = local_50 + 1) {
    pvVar10 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                        ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                         (in_RDI + 0x13),local_50);
    uVar1 = pvVar10->uncompressedByteLength;
    pvVar10 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                        ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                         (in_RDI + 0x13),local_50 - 1);
    if (pvVar10->uncompressedByteLength < uVar1) {
      in_stack_ffffffffffffffa8 = (ValidationContext *)(local_50 - 1);
      std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)(in_RDI + 0x13),
                 local_50 - 1);
      std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)(in_RDI + 0x13),
                 local_50);
      error<unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90,
                 (unsigned_long *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff80);
    }
    pvVar10 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                        ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                         (in_RDI + 0x13),local_50);
    in_stack_ffffffffffffff10 = (ValidationContext *)pvVar10->byteOffset;
    pvVar10 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                        ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                         (in_RDI + 0x13),local_50 - 1);
    if ((ValidationContext *)pvVar10->byteOffset < in_stack_ffffffffffffff10) {
      in_stack_ffffffffffffffa0 = (IssueError *)(local_50 - 1);
      in_stack_ffffffffffffff08 =
           std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                     ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                      (in_RDI + 0x13),local_50 - 1);
      std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)(in_RDI + 0x13),
                 local_50);
      error<unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90,
                 (unsigned_long *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff80);
    }
  }
  issue = (IssueError *)0x0;
  sVar9 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::size
                    ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                     (in_RDI + 0x13));
  for (iVar7 = (int)sVar9; level_00 = (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
      iVar7 != 0; iVar7 = iVar7 + -1) {
    uVar6 = iVar7 - 1;
    pvVar10 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                        ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                         (in_RDI + 0x13),(ulong)uVar6);
    local_81 = false;
    if (*(int *)((long)in_RDI + 0x44) != 0) {
      local_81 = *(int *)((long)in_RDI + 100) == 0;
    }
    if ((bool)local_81 == false) {
      in_stack_fffffffffffffef8 =
           (optional<unsigned_char> *)
           align<unsigned_long>
                     (CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (unsigned_long)in_stack_fffffffffffffee8);
      uVar12 = in_stack_fffffffffffffef4;
    }
    else {
      in_stack_fffffffffffffef8 =
           (optional<unsigned_char> *)
           calcLevelOffset(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
                           CONCAT17(local_81,in_stack_ffffffffffffff00),level_00);
      uVar12 = in_stack_fffffffffffffef4;
    }
    local_90 = in_stack_fffffffffffffef8;
    if (pvVar10->byteOffset % (ulong)uVar5 == 0) {
      if ((optional<unsigned_char> *)pvVar10->byteOffset != in_stack_fffffffffffffef8) {
        error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint *)this_00,
                   (unsigned_long *)issue,(unsigned_long *)CONCAT44(iVar7,uVar6));
      }
    }
    else {
      error<unsigned_int_const&,unsigned_long_const&,unsigned_long&,unsigned_long_const&>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint *)this_00,
                 (unsigned_long *)issue,(unsigned_long *)CONCAT44(iVar7,uVar6),&pvVar10->byteOffset)
      ;
    }
    bVar2 = isFormat3DBlockCompressed(*(VkFormat *)((long)in_RDI + 0x44));
    in_stack_fffffffffffffef4 = uVar12 & 0xffffff;
    if (bVar2) {
      in_stack_fffffffffffffef0 = *(ktxSupercmpScheme *)((long)in_RDI + 0x54);
      local_98 = 0;
      bVar4 = std::optional<unsigned_char>::value_or<int>
                        (in_stack_fffffffffffffef8,
                         (int *)(CONCAT44(uVar12,in_stack_fffffffffffffef0) & 0xffffffffffffff));
      in_stack_fffffffffffffef4 =
           CONCAT13(in_stack_fffffffffffffef0 % (bVar4 + 1) != 0,(int3)in_stack_fffffffffffffef4);
    }
    local_91 = (char)(in_stack_fffffffffffffef4 >> 0x18);
    if (local_91 == '\0') {
      if (((*(int *)((long)in_RDI + 0x44) != 0) && (*(int *)((long)in_RDI + 100) == 0)) &&
         (local_a0 = calcLevelSize((ValidationContext *)
                                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                   (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20)),
         pvVar10->byteLength != local_a0)) {
        error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint *)this_00,
                   (unsigned_long *)issue,(unsigned_long *)CONCAT44(iVar7,uVar6));
      }
      if (*(int *)((long)in_RDI + 100) == 1) {
        if (pvVar10->uncompressedByteLength != 0) {
          error<unsigned_int_const&,unsigned_long_const&>
                    (this_00,issue,(uint *)CONCAT44(iVar7,uVar6),&pvVar10->byteOffset);
        }
      }
      else if (*(int *)((long)in_RDI + 0x44) == 0) {
        if (pvVar10->uncompressedByteLength == 0) {
          error<unsigned_int_const&>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint *)this_00);
        }
        else {
          in_stack_fffffffffffffee8 = (int *)pvVar10->uncompressedByteLength;
          local_ac = *(int *)((long)in_RDI + 0x5c) * (int)in_RDI[0x11];
          local_b0 = 1;
          puVar11 = std::max<unsigned_int>(&local_ac,&local_b0);
          if ((ulong)in_stack_fffffffffffffee8 % (ulong)*puVar11 != 0) {
            error<unsigned_int_const&,unsigned_long_const&>
                      (this_00,issue,(uint *)CONCAT44(iVar7,uVar6),&pvVar10->byteOffset);
          }
        }
      }
      else if ((*(int *)((long)in_RDI + 100) == 0) &&
              (local_a8 = calcLevelSize((ValidationContext *)
                                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ),
                                        (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20)),
              pvVar10->uncompressedByteLength != local_a8)) {
        error<unsigned_int_const&,unsigned_long_const&,unsigned_long_const&>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint *)this_00,
                   (unsigned_long *)issue,(unsigned_long *)CONCAT44(iVar7,uVar6));
      }
    }
    this_00 = (ValidationContext *)pvVar10->byteOffset;
    issue = (IssueError *)pvVar10->byteLength;
  }
  return;
}

Assistant:

void ValidationContext::validateLevelIndex() {
    levelIndices.resize(numLevels);

    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    read(levelIndexOffset, levelIndices.data(), levelIndexSize, "the level index");

    const auto blockByteLength = (expectedBytePlanes ? expectedBytePlanes->at(0) : (parsedBlockByteLength == 0 ? uint8_t(1) : parsedBlockByteLength.value_or(0)));
    std::size_t requiredLevelAlignment = calcLevelAlignment(ktxSupercmpScheme(header.supercompressionScheme), blockByteLength);

    std::size_t expectedFirstLevelOffset = 0;
    if (header.supercompressionGlobalData.byteLength != 0)
        expectedFirstLevelOffset = header.supercompressionGlobalData.byteLength + header.supercompressionGlobalData.byteOffset;
    else if (header.keyValueData.byteLength != 0)
        expectedFirstLevelOffset = header.keyValueData.byteLength + header.keyValueData.byteOffset;
    else if (header.dataFormatDescriptor.byteLength != 0)
        expectedFirstLevelOffset = header.dataFormatDescriptor.byteLength + header.dataFormatDescriptor.byteOffset;
    else
        expectedFirstLevelOffset = levelIndexOffset + levelIndexSize;
    expectedFirstLevelOffset = align(expectedFirstLevelOffset, requiredLevelAlignment);

    // The first (largest) mip level is the first in the index and the last in the file.
    for (std::size_t i = 1; i < levelIndices.size(); ++i) {
        if (levelIndices[i].uncompressedByteLength > levelIndices[i - 1].uncompressedByteLength)
            error(LevelIndex::IncorrectIndexOrder, i - 1, levelIndices[i - 1].uncompressedByteLength, i, levelIndices[i].uncompressedByteLength);

        if (levelIndices[i].byteOffset > levelIndices[i - 1].byteOffset)
            error(LevelIndex::IncorrectLevelOrder, i - 1, levelIndices[i - 1].byteOffset, i, levelIndices[i].byteOffset);
    }

    std::size_t lastByteOffset = expectedFirstLevelOffset; // Reuse lastByteOffset to inject first offset to expectedOffset
    std::size_t lastByteLength = 0;

    // Count down, so we can check the distance between levels for the UNDEFINED and SUPERCOMPRESSION cases.
    for (auto it = static_cast<uint32_t>(levelIndices.size()); it != 0; --it) {
        const auto index = it - 1;
        const auto& level = levelIndices[index];

        // Validate byteOffset
        const auto knownLevelOffset = header.vkFormat != VK_FORMAT_UNDEFINED &&
                header.supercompressionScheme == KTX_SS_NONE;
        // If the exact level sizes are unknown we have to trust the byteLengths.
        // In that case we know where the first level must be in the file, and we can calculate
        // the offsets by progressively summing the lengths and paddings so far.
        const auto expectedOffset = knownLevelOffset ?
                calcLevelOffset(expectedFirstLevelOffset, requiredLevelAlignment, index) :
                align(lastByteOffset + lastByteLength, requiredLevelAlignment);

        if (level.byteOffset % requiredLevelAlignment != 0)
            error(LevelIndex::IncorrectByteOffsetUnaligned, index, level.byteOffset, requiredLevelAlignment, expectedOffset);
        else if (level.byteOffset != expectedOffset)
            error(LevelIndex::IncorrectByteOffset, index, level.byteOffset, expectedOffset);

        // Workaround: Disable ByteLength validations for the 3D ASTC encoder which currently ignores partial Z blocks in our test files
        const auto disableByteLengthValidation = isFormat3DBlockCompressed(VkFormat(header.vkFormat))
                && header.pixelDepth % (expectedBlockDimension2.value_or(0) + 1) != 0;

        if (!disableByteLengthValidation) {
            // Validate byteLength
            if (header.vkFormat != VK_FORMAT_UNDEFINED && header.supercompressionScheme == KTX_SS_NONE) {
                const auto expectedLength = calcLevelSize(index);
                if (level.byteLength != expectedLength)
                    error(LevelIndex::IncorrectByteLength, index, level.byteLength, expectedLength);
            }

            // Validate uncompressedByteLength
            if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
                if (level.uncompressedByteLength != 0)
                    error(LevelIndex::NonZeroUBLForBLZE, index, level.uncompressedByteLength);
            } else if (header.vkFormat != VK_FORMAT_UNDEFINED) {
                if (header.supercompressionScheme == KTX_SS_NONE) {
                    const auto expectedUncompressedLength = calcLevelSize(index);
                    if (level.uncompressedByteLength != expectedUncompressedLength)
                        error(LevelIndex::IncorrectUncompressedByteLength, index, level.uncompressedByteLength, expectedUncompressedLength);
                }
            } else {
                if (level.uncompressedByteLength == 0)
                    error(LevelIndex::ZeroUncompressedLength, index);
                else if (level.uncompressedByteLength % std::max(header.faceCount * numLayers, 1u) != 0)
                    // On the other branches uncompressedByteLength is always checked exactly,
                    // so this is the only branch where this checks yields useful information
                    error(LevelIndex::InvalidUncompressedLength, index, level.uncompressedByteLength);
            }
        }

        lastByteOffset = level.byteOffset;
        lastByteLength = level.byteLength;
    }
}